

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O1

int __thiscall serial::Serial::SerialImpl::open(SerialImpl *this,char *__file,int __oflag,...)

{
  int iVar1;
  int extraout_EAX;
  int *piVar2;
  IOException *pIVar3;
  SerialException *this_00;
  code *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  string local_60;
  string local_40;
  
  do {
    if ((this->port_)._M_string_length == 0) {
      this_00 = (SerialException *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument((invalid_argument *)this_00,"Empty port is invalid.");
      ppuVar5 = (pointer_____offset_0x10___ *)&std::invalid_argument::typeinfo;
      pcVar4 = std::invalid_argument::~invalid_argument;
LAB_0010d599:
      __cxa_throw(this_00,ppuVar5,pcVar4);
    }
    if (this->is_open_ == true) {
      this_00 = (SerialException *)__cxa_allocate_exception(0x28);
      SerialException::SerialException(this_00,"Serial port already open.");
      ppuVar5 = &SerialException::typeinfo;
      pcVar4 = SerialException::~SerialException;
      goto LAB_0010d599;
    }
    iVar1 = ::open((this->port_)._M_dataplus._M_p,0x902);
    this->fd_ = iVar1;
    if (iVar1 != -1) {
      reconfigurePort(this);
      this->is_open_ = true;
      return extraout_EAX;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      if (*piVar2 - 0x17U < 2) {
        pIVar3 = (IOException *)__cxa_allocate_exception(0x58);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/impl/unix.cc"
                   ,"");
        IOException::IOException(pIVar3,&local_40,0x95,"Too many file handles open.");
        __cxa_throw(pIVar3,&IOException::typeinfo,IOException::~IOException);
      }
      pIVar3 = (IOException *)__cxa_allocate_exception(0x58);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/impl/unix.cc"
                 ,"");
      IOException::IOException(pIVar3,&local_60,0x97,*piVar2);
      __cxa_throw(pIVar3,&IOException::typeinfo,IOException::~IOException);
    }
  } while( true );
}

Assistant:

void
Serial::SerialImpl::open ()
{
  if (port_.empty ()) {
    throw invalid_argument ("Empty port is invalid.");
  }
  if (is_open_ == true) {
    throw SerialException ("Serial port already open.");
  }

  fd_ = ::open (port_.c_str(), O_RDWR | O_NOCTTY | O_NONBLOCK);

  if (fd_ == -1) {
    switch (errno) {
    case EINTR:
      // Recurse because this is a recoverable error.
      open ();
      return;
    case ENFILE:
    case EMFILE:
      THROW (IOException, "Too many file handles open.");
    default:
      THROW (IOException, errno);
    }
  }

  reconfigurePort();
  is_open_ = true;
}